

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureUnitTests.cpp
# Opt level: O0

Vector<tcu::Vector<float,_2>,_3> *
deqp::gles3::Functional::calculateLodDerivateParts
          (Vector<tcu::Vector<float,_2>,_3> *__return_storage_ptr__,Mat4 *transformation)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  float *pfVar5;
  Vector<float,_2> local_108;
  Vector<float,_2> local_100;
  Vector<float,_2> local_f8;
  Vector<float,_4> local_f0;
  Vector<float,_4> local_e0;
  VecAccess<float,_4,_3> local_d0;
  undefined1 local_b4 [8];
  Vec3 trans10;
  Vector<float,_4> local_98;
  VecAccess<float,_4,_3> local_88;
  undefined1 local_6c [8];
  Vec3 trans01;
  Vector<float,_4> local_50;
  VecAccess<float,_4,_3> local_40;
  undefined1 local_24 [8];
  Vec3 trans00;
  Mat4 *transformation_local;
  
  trans00.m_data._4_8_ = transformation;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(trans01.m_data + 1),0.0,0.0,1.0,1.0);
  tcu::operator*((tcu *)&local_50,transformation,(Vector<float,_4> *)(trans01.m_data + 1));
  tcu::Vector<float,_4>::xyz(&local_40,&local_50);
  tcu::VecAccess::operator_cast_to_Vector((VecAccess *)local_24);
  uVar4 = trans00.m_data._4_8_;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(trans10.m_data + 1),0.0,1.0,1.0,1.0);
  tcu::operator*((tcu *)&local_98,(Matrix<float,_4,_4> *)uVar4,
                 (Vector<float,_4> *)(trans10.m_data + 1));
  tcu::Vector<float,_4>::xyz(&local_88,&local_98);
  tcu::VecAccess::operator_cast_to_Vector((VecAccess *)local_6c);
  uVar4 = trans00.m_data._4_8_;
  tcu::Vector<float,_4>::Vector(&local_f0,1.0,0.0,1.0,1.0);
  tcu::operator*((tcu *)&local_e0,(Matrix<float,_4,_4> *)uVar4,&local_f0);
  tcu::Vector<float,_4>::xyz(&local_d0,&local_e0);
  tcu::VecAccess::operator_cast_to_Vector((VecAccess *)local_b4);
  pfVar5 = tcu::Vector<float,_3>::x((Vector<float,_3> *)local_b4);
  fVar1 = *pfVar5;
  pfVar5 = tcu::Vector<float,_3>::x((Vector<float,_3> *)local_24);
  fVar2 = *pfVar5;
  pfVar5 = tcu::Vector<float,_3>::x((Vector<float,_3> *)local_6c);
  fVar3 = *pfVar5;
  pfVar5 = tcu::Vector<float,_3>::x((Vector<float,_3> *)local_24);
  tcu::Vector<float,_2>::Vector(&local_f8,fVar1 - fVar2,fVar3 - *pfVar5);
  pfVar5 = tcu::Vector<float,_3>::y((Vector<float,_3> *)local_b4);
  fVar1 = *pfVar5;
  pfVar5 = tcu::Vector<float,_3>::y((Vector<float,_3> *)local_24);
  fVar2 = *pfVar5;
  pfVar5 = tcu::Vector<float,_3>::y((Vector<float,_3> *)local_6c);
  fVar3 = *pfVar5;
  pfVar5 = tcu::Vector<float,_3>::y((Vector<float,_3> *)local_24);
  tcu::Vector<float,_2>::Vector(&local_100,fVar1 - fVar2,fVar3 - *pfVar5);
  pfVar5 = tcu::Vector<float,_3>::z((Vector<float,_3> *)local_b4);
  fVar1 = *pfVar5;
  pfVar5 = tcu::Vector<float,_3>::z((Vector<float,_3> *)local_24);
  fVar2 = *pfVar5;
  pfVar5 = tcu::Vector<float,_3>::z((Vector<float,_3> *)local_6c);
  fVar3 = *pfVar5;
  pfVar5 = tcu::Vector<float,_3>::z((Vector<float,_3> *)local_24);
  tcu::Vector<float,_2>::Vector(&local_108,fVar1 - fVar2,fVar3 - *pfVar5);
  tcu::Vector<tcu::Vector<float,_2>,_3>::Vector
            (__return_storage_ptr__,&local_f8,&local_100,&local_108);
  return __return_storage_ptr__;
}

Assistant:

static tcu::Vector<tcu::Vec2, 3> calculateLodDerivateParts (const Mat4& transformation)
{
	// Calculate transformed coordinates of three screen corners.
	Vec3 trans00 = (transformation * Vec4(0.0f, 0.0f, 1.0f, 1.0f)).xyz();
	Vec3 trans01 = (transformation * Vec4(0.0f, 1.0f, 1.0f, 1.0f)).xyz();
	Vec3 trans10 = (transformation * Vec4(1.0f, 0.0f, 1.0f, 1.0f)).xyz();

	return tcu::Vector<tcu::Vec2, 3>(Vec2(trans10.x() - trans00.x(), trans01.x() - trans00.x()),
									 Vec2(trans10.y() - trans00.y(), trans01.y() - trans00.y()),
									 Vec2(trans10.z() - trans00.z(), trans01.z() - trans00.z()));
}